

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O1

string * __thiscall
OpenMPAlignedClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPAlignedClause *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  string clause_string;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"aligned ","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"(","");
  OpenMPClause::expressionToString_abi_cxx11_(&local_70,&this->super_OpenMPClause);
  std::__cxx11::string::_M_append((char *)local_50,(ulong)local_70._M_dataplus._M_p);
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->user_defined_alignment)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + (this->user_defined_alignment)._M_string_length);
  iVar3 = std::__cxx11::string::compare((char *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (iVar3 != 0) {
    std::__cxx11::string::append((char *)local_50);
    pcVar2 = (this->user_defined_alignment)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + (this->user_defined_alignment)._M_string_length);
    std::__cxx11::string::_M_append((char *)local_50,(ulong)local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)local_50);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPAlignedClause::toString() {

    std::string result = "aligned ";
    std::string clause_string = "(";
    clause_string += this->expressionToString();
    if(this->getUserDefinedAlignment() != ""){
        clause_string += ":";
        clause_string += this->getUserDefinedAlignment();
    }
        clause_string += ") ";
        result += clause_string;
    return result;
}